

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O0

void __thiscall
klogic::learning::
teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
::learn_run<TolerancePicker>
          (teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
           *this,TolerancePicker *picker)

{
  mlmvn *pmVar1;
  const_iterator this_00;
  bool bVar2;
  pointer psVar3;
  reference sample;
  pointer psVar4;
  cvector local_70;
  undefined1 local_48 [8];
  desired_type actual;
  __normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
  local_28;
  __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
  local_20;
  const_iterator i;
  TolerancePicker *picker_local;
  teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  *this_local;
  
  i._M_current = (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                  *)picker;
  local_28._M_current =
       (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *)
       std::
       vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
       ::begin(&this->_samples);
  __gnu_cxx::
  __normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>const*,std::vector<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,std::allocator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>>>
  ::
  __normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>*>
            ((__normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>const*,std::vector<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,std::allocator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>>>
              *)&local_20,&local_28);
  while( true ) {
    actual.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
                  ::end(&this->_samples);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
                        *)&actual.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    pmVar1 = this->learner;
    psVar3 = __gnu_cxx::
             __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
             ::operator->(&local_20);
    mlmvn::output((cvector *)local_48,pmVar1,&psVar3->input);
    this_00 = i;
    sample = __gnu_cxx::
             __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
             ::operator*(&local_20);
    bVar2 = TolerancePicker::operator()
                      ((TolerancePicker *)this_00._M_current,sample,(cvector *)local_48);
    if (bVar2) {
      pmVar1 = this->learner;
      psVar3 = __gnu_cxx::
               __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
               ::operator->(&local_20);
      psVar4 = __gnu_cxx::
               __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
               ::operator->(&local_20);
      learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      operator()(&local_70,
                 (learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                  *)&this->field_0x20,(cvector *)local_48,&psVar4->desired);
      mlmvn::learn(pmVar1,&psVar3->input,&local_70,1.0);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(&local_70);
    }
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_48);
    __gnu_cxx::
    __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void learn_run(SamplePicker const &picker = SamplePicker()) {
                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    typename Sample::desired_type actual = learner.output(i->input);

                    if (picker(*i, actual))
                        learner.learn(i->input, learn_error(actual, i->desired));
                }
            }